

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CS248::Application::toggle_create_joint_action(Application *this)

{
  long in_RDI;
  bool in_stack_0000000f;
  
  if (*(int *)(in_RDI + 0x10) == 3) {
    *(undefined4 *)(in_RDI + 0x10) = 7;
    setGhosted(this,in_stack_0000000f);
  }
  else {
    *(undefined4 *)(in_RDI + 0x10) = 3;
    setGhosted(this,in_stack_0000000f);
  }
  return;
}

Assistant:

void Application::toggle_create_joint_action() {
  if (action != Action::CreateJoint) {
    action = Action::CreateJoint;
    setGhosted(true);
  } else {
    action = Action::Object;
    setGhosted(false);
  }
}